

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O2

int uv__signal_compare(uv_signal_t *w1,uv_signal_t *w2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  iVar1 = -1;
  if (w1->signum < w2->signum) {
    return iVar1;
  }
  iVar2 = 1;
  if (w1->signum <= w2->signum) {
    uVar4 = w1->flags & 0x80000;
    uVar3 = w2->flags & 0x80000;
    if (uVar4 < uVar3) {
      return iVar1;
    }
    if (uVar4 <= uVar3) {
      if (w1->loop < w2->loop) {
        return iVar1;
      }
      if ((w1->loop <= w2->loop) && (iVar2 = iVar1, w2 <= w1)) {
        return (int)(w2 < w1);
      }
    }
  }
  return iVar2;
}

Assistant:

static int uv__signal_compare(uv_signal_t* w1, uv_signal_t* w2) {
  int f1;
  int f2;
  /* Compare signums first so all watchers with the same signnum end up
   * adjacent.
   */
  if (w1->signum < w2->signum) return -1;
  if (w1->signum > w2->signum) return 1;

  /* Handlers without UV__SIGNAL_ONE_SHOT set will come first, so if the first
   * handler returned is a one-shot handler, the rest will be too.
   */
  f1 = w1->flags & UV__SIGNAL_ONE_SHOT;
  f2 = w2->flags & UV__SIGNAL_ONE_SHOT;
  if (f1 < f2) return -1;
  if (f1 > f2) return 1;

  /* Sort by loop pointer, so we can easily look up the first item after
   * { .signum = x, .loop = NULL }.
   */
  if (w1->loop < w2->loop) return -1;
  if (w1->loop > w2->loop) return 1;

  if (w1 < w2) return -1;
  if (w1 > w2) return 1;

  return 0;
}